

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMemCheckHandler.cxx
# Opt level: O2

void __thiscall
cmCTestMemCheckHandler::PostProcessTest
          (cmCTestMemCheckHandler *this,cmCTestTestResult *res,int test)

{
  cmCTest *this_00;
  ostream *poVar1;
  string *f;
  string *ofile;
  char *local_1c8 [4];
  ostringstream cmCTestLog_msg;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
  poVar1 = std::operator<<((ostream *)&cmCTestLog_msg,"PostProcessTest memcheck results for : ");
  poVar1 = std::operator<<(poVar1,(string *)res);
  std::endl<char,std::char_traits<char>>(poVar1);
  this_00 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(this_00,5,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestMemCheckHandler.cxx"
               ,0x4f8,local_1c8[0],
               (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.Quiet);
  std::__cxx11::string::~string((string *)local_1c8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
  if (this->MemoryTesterStyle == 3) {
    PostProcessDrMemoryTest(this,res,test);
  }
  else if (this->MemoryTesterStyle == 4) {
    PostProcessBoundsCheckerTest(this,res,test);
  }
  else {
    _cmCTestLog_msg = (string *)0x0;
    TestOutputFileNames(this,test,
                        (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&cmCTestLog_msg);
    for (ofile = _cmCTestLog_msg; ofile != (string *)0x0; ofile = ofile + 1) {
      AppendMemTesterOutput(this,res,ofile);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&cmCTestLog_msg);
  }
  return;
}

Assistant:

void cmCTestMemCheckHandler::PostProcessTest(cmCTestTestResult& res, int test)
{
  cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                     "PostProcessTest memcheck results for : " << res.Name
                                                               << std::endl,
                     this->Quiet);
  if (this->MemoryTesterStyle == cmCTestMemCheckHandler::BOUNDS_CHECKER) {
    this->PostProcessBoundsCheckerTest(res, test);
  } else if (this->MemoryTesterStyle == cmCTestMemCheckHandler::DRMEMORY) {
    this->PostProcessDrMemoryTest(res, test);
  } else {
    std::vector<std::string> files;
    this->TestOutputFileNames(test, files);
    for (std::string const& f : files) {
      this->AppendMemTesterOutput(res, f);
    }
  }
}